

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvk_algorithm.c
# Opt level: O1

void fvk_c(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  solver_state_c s;
  int local_168 [4];
  long local_158;
  long local_150;
  long local_140;
  long local_138;
  long local_130;
  undefined8 *local_f8;
  undefined8 *local_f0;
  
  setup_simple_state_c(&two_dof_robot_c,local_168);
  *local_f8 = 0x3ff0000000000000;
  local_f8[1] = 0x3ff0000000000000;
  *local_f0 = 0x3ff0000000000000;
  local_f0[1] = 0x3ff0000000000000;
  if (0 < local_168[0]) {
    lVar6 = 0x10;
    lVar3 = 0;
    lVar2 = 0;
    lVar1 = 0;
    do {
      lVar5 = _ga_pose_compose + lVar6;
      lVar4 = (long)*(int *)(_ga_pose_compose + lVar6) * 0x40;
      (**(code **)(&kcc_joint + lVar4))(lVar5,(long)local_f8 + lVar2,local_158 + lVar3);
      gc_pose_compose(local_158 + lVar3,_ga_pose_compose + lVar6 + -0x10,local_150 + lVar3);
      (**(code **)(&two_dof_robot_a + lVar4))(lVar5,(long)local_f0 + lVar2,local_140 + lVar3);
      gc_twist_tf_ref_to_tgt(local_150 + lVar3,local_130 + lVar3,local_138 + lVar3);
      lVar5 = local_138 + lVar3;
      lVar4 = local_140 + lVar3;
      lVar3 = lVar3 + 0x10;
      gc_twist_accumulate(lVar5,lVar4,local_130 + lVar3);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 8;
      lVar6 = lVar6 + 0x90;
    } while (lVar1 < local_168[0]);
  }
  gc_twist_log((long)local_168[0] * 0x10 + local_130);
  return;
}

Assistant:

void fvk_c()
{
    struct kcc_kinematic_chain *kc = &two_dof_robot_c;
    struct solver_state_c s;

    setup_simple_state_c(kc, &s);

    s.q[0] = 1.0;
    s.q[1] = 1.0;
    s.qd[0] = 1.0;
    s.qd[1] = 1.0;


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kcc_joint *joint = &kc->segment[i - 1].joint;
        int joint_type = joint->type;

        // Position
        //

        // X_{J,i}
        kcc_joint[joint_type].fpk(joint, &s.q[i - 1], &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        gc_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kcc_joint[joint_type].fvk(joint, &s.qd[i - 1], &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        gc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        gc_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);
    }

    gc_twist_log(&s.xd[s.nbody]);
}